

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ComputeWorkGroupSizeCase::iterate
          (ComputeWorkGroupSizeCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  ProgramSources *pPVar5;
  TestError *pTVar6;
  ScopedLogSection section;
  string local_278;
  undefined1 local_258 [40];
  CallLogWrapper gl;
  ShaderProgram program;
  ProgramSources local_148;
  ResultCollector result;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program," // ERROR: ",(allocator<char> *)&local_148);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"OneDimensional",(allocator<char> *)local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"1D",(allocator<char> *)&local_278);
  pPVar5 = &local_148;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)pPVar5);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_148,0,0xac);
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_148._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_278,(_anonymous_namespace_ *)pCVar2,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)pPVar5);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_258,&local_278);
  pPVar5 = glu::ProgramSources::operator<<(&local_148,(ShaderSource *)local_258);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar5);
  std::__cxx11::string::~string((string *)(local_258 + 8));
  std::__cxx11::string::~string((string *)&local_278);
  glu::ProgramSources::~ProgramSources(&local_148);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"failed to build program","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x1fa);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_148.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000003;
  local_148.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
  gls::StateQueryUtil::verifyStateProgramIntegerVec3
            (&result,&gl,program.m_program.m_program,0x8267,(IVec3 *)&local_148,this->m_verifier);
  glu::ShaderProgram::~ShaderProgram(&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"TwoDimensional",(allocator<char> *)local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"2D",(allocator<char> *)&local_278);
  pPVar5 = &local_148;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)pPVar5);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_148,0,0xac);
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_148.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_148._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_278,(_anonymous_namespace_ *)pCVar2,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3, local_size_y = 2) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)pPVar5);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_258,&local_278);
  pPVar5 = glu::ProgramSources::operator<<(&local_148,(ShaderSource *)local_258);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar5);
  std::__cxx11::string::~string((string *)(local_258 + 8));
  std::__cxx11::string::~string((string *)&local_278);
  glu::ProgramSources::~ProgramSources(&local_148);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk != false) {
    local_148.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000003;
    local_148.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    gls::StateQueryUtil::verifyStateProgramIntegerVec3
              (&result,&gl,program.m_program.m_program,0x8267,(IVec3 *)&local_148,this->m_verifier);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,"TreeDimensional",(allocator<char> *)local_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"3D",(allocator<char> *)&local_278);
    pPVar5 = &local_148;
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)pPVar5);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&program);
    pCVar2 = (this->super_TestCase).m_context;
    pRVar3 = pCVar2->m_renderCtx;
    memset(&local_148,0,0xac);
    local_148.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_148.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_148.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_148._193_8_ = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_278,(_anonymous_namespace_ *)pCVar2,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3, local_size_y = 2, local_size_z = 4) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
               ,(char *)pPVar5);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_258,&local_278);
    pPVar5 = glu::ProgramSources::operator<<(&local_148,(ShaderSource *)local_258);
    glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar5);
    std::__cxx11::string::~string((string *)(local_258 + 8));
    std::__cxx11::string::~string((string *)&local_278);
    glu::ProgramSources::~ProgramSources(&local_148);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program
                   );
    if (program.m_program.m_info.linkOk != false) {
      local_148.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000003;
      local_148.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
      gls::StateQueryUtil::verifyStateProgramIntegerVec3
                (&result,&gl,program.m_program.m_program,0x8267,(IVec3 *)&local_148,this->m_verifier
                );
      glu::ShaderProgram::~ShaderProgram(&program);
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      tcu::ResultCollector::setTestContextResult
                (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector(&result);
      glu::CallLogWrapper::~CallLogWrapper(&gl);
      return STOP;
    }
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"failed to build program","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x210);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"failed to build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x205);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ComputeWorkGroupSizeCase::IterateResult ComputeWorkGroupSizeCase::iterate (void)
{
	static const char* const	s_computeTemplate1D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate2D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3, local_size_y = 2) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate3D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3, local_size_y = 2, local_size_z = 4) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "OneDimensional", "1D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate1D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 1, 1), m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "TwoDimensional", "2D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate2D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 2, 1), m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "TreeDimensional", "3D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate3D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 2, 4), m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}